

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O2

void __thiscall OpenMD::TimeCorrFunc<double>::doCorrelate(TimeCorrFunc<double> *this)

{
  painCave.isFatal = 0;
  painCave.severity = 3;
  builtin_strncpy(painCave.errMsg,"Starting pre-correlate scan.",0x1d);
  simError();
  (*(this->super_DynamicProperty)._vptr_DynamicProperty[3])(this);
  builtin_strncpy(painCave.errMsg,"Calculating correlation function.",0x22);
  simError();
  (*(this->super_DynamicProperty)._vptr_DynamicProperty[4])(this);
  builtin_strncpy(painCave.errMsg,"Doing post-correlation calculations.",0x25);
  simError();
  (*(this->super_DynamicProperty)._vptr_DynamicProperty[5])(this);
  builtin_strncpy(painCave.errMsg,"Writing output.",0x10);
  simError();
  (*(this->super_DynamicProperty)._vptr_DynamicProperty[9])(this);
  return;
}

Assistant:

void TimeCorrFunc<T>::doCorrelate() {
    painCave.isFatal  = 0;
    painCave.severity = OPENMD_INFO;
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Starting pre-correlate scan.");
    simError();
    preCorrelate();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Calculating correlation function.");
    simError();
    correlation();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Doing post-correlation calculations.");
    simError();
    postCorrelate();

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "Writing output.");
    simError();
    writeCorrelate();
  }